

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::pipeline::anon_unknown_0::PipelineFromIncompleteCacheTest::createInstance
          (PipelineFromIncompleteCacheTest *this,Context *context)

{
  PipelineFromIncompleteCacheTestInstance *this_00;
  Context *context_local;
  PipelineFromIncompleteCacheTest *this_local;
  
  this_00 = (PipelineFromIncompleteCacheTestInstance *)operator_new(0x598);
  PipelineFromIncompleteCacheTestInstance::PipelineFromIncompleteCacheTestInstance
            (this_00,context,&(this->super_GraphicsCacheTest).super_CacheTest.m_param);
  return (TestInstance *)this_00;
}

Assistant:

TestInstance* PipelineFromIncompleteCacheTest::createInstance (Context& context) const
{
	return new PipelineFromIncompleteCacheTestInstance(context, &m_param);
}